

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall
coins_tests::FlushTest::TestFlushBehavior
          (FlushTest *this,CCoinsViewCacheTest *view,CCoinsViewDB *base,
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          *all_caches,bool do_erasing_flush)

{
  long lVar1;
  bool bVar2;
  pointer pCVar3;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffe458;
  COutPoint *in_stack_ffffffffffffe460;
  char *in_stack_ffffffffffffe468;
  undefined7 in_stack_ffffffffffffe470;
  undefined1 in_stack_ffffffffffffe477;
  CCoinsViewDB *in_stack_ffffffffffffe478;
  undefined7 in_stack_ffffffffffffe480;
  undefined1 in_stack_ffffffffffffe487;
  CCoinsViewCache *in_stack_ffffffffffffe488;
  size_t line_num;
  lazy_ostream *in_stack_ffffffffffffe490;
  undefined7 in_stack_ffffffffffffe498;
  undefined1 in_stack_ffffffffffffe49f;
  undefined8 in_stack_ffffffffffffe4a0;
  undefined1 possible_overwrite;
  Coin *in_stack_ffffffffffffe4a8;
  COutPoint *in_stack_ffffffffffffe4b0;
  CCoinsViewCache *in_stack_ffffffffffffe4b8;
  logic_error *ex;
  bool do_erasing_flush_local;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  *all_caches_local;
  CCoinsViewDB *base_local;
  CCoinsViewCacheTest *view_local;
  FlushTest *this_local;
  const_string local_1768 [2];
  lazy_ostream local_1748 [2];
  assertion_result local_1728 [2];
  const_string local_16f0 [2];
  lazy_ostream local_16d0 [2];
  assertion_result local_16b0 [2];
  undefined1 local_1678 [16];
  undefined1 local_1668 [64];
  undefined1 local_1628 [16];
  undefined1 local_1618 [64];
  const_string local_15d8 [2];
  lazy_ostream local_15b8 [2];
  assertion_result local_1598 [2];
  const_string local_1560 [2];
  lazy_ostream local_1540 [2];
  assertion_result local_1520 [2];
  COutPoint local_14e4 [2];
  undefined1 local_1490 [16];
  undefined1 local_1480 [64];
  const_string local_1440 [2];
  lazy_ostream local_1420 [2];
  assertion_result local_1400 [2];
  const_string local_13c8 [2];
  lazy_ostream local_13a8 [2];
  assertion_result local_1388 [2];
  const_string local_1350 [2];
  lazy_ostream local_1330 [2];
  assertion_result local_1310 [2];
  CAmount coin_val;
  const_string local_12d0 [2];
  lazy_ostream local_12b0 [2];
  assertion_result local_1290 [2];
  const_string local_1258 [2];
  lazy_ostream local_1238 [2];
  assertion_result local_1218 [2];
  const_string local_11e0 [2];
  lazy_ostream local_11c0 [2];
  assertion_result local_11a0 [2];
  const_string local_1168 [2];
  lazy_ostream local_1148 [2];
  assertion_result local_1128 [2];
  const_string local_10f0 [2];
  lazy_ostream local_10d0 [2];
  assertion_result local_10b0 [2];
  const_string local_1078 [2];
  lazy_ostream local_1058 [2];
  assertion_result local_1038 [2];
  const_string local_1000 [2];
  lazy_ostream local_fe0 [2];
  assertion_result local_fc0 [2];
  const_string local_f88 [2];
  lazy_ostream local_f68 [2];
  assertion_result local_f48 [2];
  const_string local_f10 [2];
  lazy_ostream local_ef0 [2];
  assertion_result local_ed0 [2];
  const_string local_e98 [2];
  lazy_ostream local_e78 [2];
  assertion_result local_e58 [2];
  const_string local_e20 [2];
  lazy_ostream local_e00 [2];
  assertion_result local_de0 [2];
  const_string local_da8 [2];
  lazy_ostream local_d88 [2];
  assertion_result local_d68 [2];
  const_string local_d30 [2];
  lazy_ostream local_d10 [2];
  assertion_result local_cf0 [2];
  const_string local_cb8 [2];
  lazy_ostream local_c98 [2];
  assertion_result local_c78 [2];
  const_string local_c40 [2];
  lazy_ostream local_c20 [2];
  assertion_result local_c00 [2];
  undefined1 local_bc8 [16];
  undefined1 local_bb8 [64];
  undefined1 local_b78 [16];
  undefined1 local_b68 [64];
  const_string local_b28 [2];
  lazy_ostream local_b08 [2];
  assertion_result local_ae8 [6];
  const_string local_a48;
  lazy_ostream local_a38 [2];
  assertion_result local_a18 [3];
  COutPoint local_9bc [2];
  undefined1 local_968 [16];
  undefined1 local_958 [64];
  undefined1 local_918 [16];
  undefined1 local_908 [64];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [64];
  const_string local_878 [2];
  lazy_ostream local_858 [2];
  size_type local_838;
  assertion_result local_810 [2];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [2];
  size_t local_798;
  assertion_result local_770 [2];
  const_string local_738 [2];
  lazy_ostream local_718 [2];
  assertion_result local_6f8 [2];
  const_string local_6c0 [2];
  lazy_ostream local_6a0 [2];
  assertion_result local_680 [2];
  COutPoint local_644 [2];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [64];
  COutPoint local_5a0 [2];
  COutPoint local_548 [2];
  COutPoint local_4ec [2];
  undefined1 local_498 [16];
  undefined1 local_488 [64];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  assertion_result local_408 [2];
  const_string local_3d0 [2];
  lazy_ostream local_3b0 [2];
  assertion_result local_390 [2];
  const_string local_358 [2];
  lazy_ostream local_338 [2];
  assertion_result local_318 [2];
  const_string local_2e0 [2];
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  anon_class_16_2_c349ca0a flush_all;
  size_t cache_size;
  size_t cache_usage;
  char flags;
  CAmount value;
  uchar local_204 [8];
  uchar auStack_1fc [8];
  uchar local_1f4 [8];
  uchar auStack_1ec [8];
  uint32_t local_1e4;
  uchar local_16c [8];
  uchar auStack_164 [8];
  uchar local_15c [8];
  uchar auStack_154 [8];
  uint32_t local_14c;
  Coin coin;
  COutPoint outp;
  Txid txid;
  
  local_1000[0].m_begin = (iterator)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flush_all.this = this;
  flush_all.all_caches = all_caches;
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe488);
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffe458);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffe468,&in_stack_ffffffffffffe460->hash,
             (uint32_t)((ulong)in_stack_ffffffffffffe458 >> 0x20));
  MakeCoin((FlushTest *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a0,local_2c0,local_2e0,0x3b4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (view,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_318,local_338,local_358,0x3b5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Coin::Coin((Coin *)in_stack_ffffffffffffe468,(Coin *)in_stack_ffffffffffffe460);
  CCoinsViewCache::AddCoin
            (in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,
             SUB81((ulong)in_stack_ffffffffffffe4a0 >> 0x38,0));
  Coin::~Coin((Coin *)in_stack_ffffffffffffe458);
  cache_usage = CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_ffffffffffffe468);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
  cache_size = std::
               unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
               ::size((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                       *)in_stack_ffffffffffffe458);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_390,local_3b0,local_3d0,0x3bf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (view,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_408,local_428,local_448,0x3c0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
  GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                   (char *)in_stack_ffffffffffffe458,(COutPoint *)0x5120a0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "coin.out.nValue";
    in_stack_ffffffffffffe460 = (COutPoint *)&coin;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1ba8aa7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_488,local_498,0x3c3,1,2,&value);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    local_4ec[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x03';
    local_4ec[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_4ec[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_4ec[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_stack_ffffffffffffe468 = "DIRTY|FRESH";
    in_stack_ffffffffffffe460 = local_4ec;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1d3e9e5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
              (local_4ec[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14,
               local_4ec[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 4,0x3c4,1,2,
               &flags);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()
            ((anon_class_16_2_c349ca0a *)in_stack_ffffffffffffe478,(bool)in_stack_ffffffffffffe477);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    local_548[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_ffffffffffffe468);
    in_stack_ffffffffffffe468 = "view->DynamicMemoryUsage()";
    in_stack_ffffffffffffe460 = local_548;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1bcaa1b;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_548[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18,
               local_548[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8,0x3cb,1,2,
               &cache_usage);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
              ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
    local_5a0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         std::
         unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
         ::size((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                 *)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "view->map().size()";
    in_stack_ffffffffffffe460 = local_5a0;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1bcaa3c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_5a0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18,
               local_5a0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8,0x3cc,1,2,
               &cache_size);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
  GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                   (char *)in_stack_ffffffffffffe458,(COutPoint *)0x512543);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "coin.out.nValue";
    in_stack_ffffffffffffe460 = (COutPoint *)&coin;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1ba8aa7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_5e0,local_5f0,0x3d1,1,2,&value);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    local_644[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_644[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_644[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_644[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_stack_ffffffffffffe468 = "0";
    in_stack_ffffffffffffe460 = local_644;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1d3e9e5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
              (local_644[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14,
               local_644[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 4,0x3d2,1,2,
               &flags);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_680,local_6a0,local_6c0,0x3d5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (view,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6f8,local_718,local_738,0x3d6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (do_erasing_flush) {
    TestFlushBehavior::anon_class_16_2_c349ca0a::operator()
              ((anon_class_16_2_c349ca0a *)in_stack_ffffffffffffe478,(bool)in_stack_ffffffffffffe477
              );
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      local_798 = CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_ffffffffffffe468);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_ffffffffffffe460,(unsigned_long *)in_stack_ffffffffffffe458);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
      operator<=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                  *)in_stack_ffffffffffffe460,(unsigned_long *)in_stack_ffffffffffffe458);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                  *)in_stack_ffffffffffffe490,SUB81((ulong)in_stack_ffffffffffffe488 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_770,local_7b8,local_7d8,0x3de,CHECK,CHECK_BUILT_ASSERTION);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
                ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
      local_838 = std::
                  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                  ::size((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                          *)in_stack_ffffffffffffe458);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_ffffffffffffe460,(unsigned_long *)in_stack_ffffffffffffe458);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
      operator<((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                 *)in_stack_ffffffffffffe460,(unsigned_long *)in_stack_ffffffffffffe458);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LT<unsigned_long,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LT<unsigned_long,_unsigned_long,_void>_>
                  *)in_stack_ffffffffffffe490,SUB81((ulong)in_stack_ffffffffffffe488 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_810,local_858,local_878,0x3e0,CHECK,CHECK_BUILT_ASSERTION);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
              ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
    GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                     (char *)in_stack_ffffffffffffe458,(COutPoint *)0x512d9f);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      in_stack_ffffffffffffe468 = "ABSENT";
      in_stack_ffffffffffffe460 = (COutPoint *)&ABSENT;
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x1ba8aa7;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_8b8,local_8c8,0x3e5,1,2,&value);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      in_stack_ffffffffffffe468 = "NO_ENTRY";
      in_stack_ffffffffffffe460 = (COutPoint *)&NO_ENTRY;
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x1d3e9e5;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
                (local_908,local_918,0x3e6,1,2,&flags);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CCoinsViewCache::AccessCoin
              ((CCoinsViewCache *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
              ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
    GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                     (char *)in_stack_ffffffffffffe458,(COutPoint *)0x512fed);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      in_stack_ffffffffffffe468 = "coin.out.nValue";
      in_stack_ffffffffffffe460 = (COutPoint *)&coin;
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x1ba8aa7;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_958,local_968,0x3ea,1,2,&value);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      local_9bc[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_9bc[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_9bc[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_9bc[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_ffffffffffffe468 = "0";
      in_stack_ffffffffffffe460 = local_9bc;
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x1d3e9e5;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
                (local_9bc[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14,
                 local_9bc[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 4,0x3eb,1,2,
                 &flags);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    Coin::Coin((Coin *)in_stack_ffffffffffffe468,(Coin *)in_stack_ffffffffffffe460);
    CCoinsViewCache::AddCoin
              (in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,
               SUB81((ulong)in_stack_ffffffffffffe4a0 >> 0x38,0));
    Coin::~Coin((Coin *)in_stack_ffffffffffffe458);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
                 (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe468,
                 SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [51])in_stack_ffffffffffffe458)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
                 (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
      in_stack_ffffffffffffe458 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_a18,local_a38,&local_a48,0x3f2,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                          *)in_stack_ffffffffffffe458);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe458);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewCache::SpendCoin
              (in_stack_ffffffffffffe488,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480),
               (Coin *)in_stack_ffffffffffffe478);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ae8,local_b08,local_b28,0x3f6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
  GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                   (char *)in_stack_ffffffffffffe458,(COutPoint *)0x513bb3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "SPENT";
    in_stack_ffffffffffffe460 = (COutPoint *)&SPENT;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1ba8aa7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b68,local_b78,0x3fa,1,2,&value);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "DIRTY";
    in_stack_ffffffffffffe460 = (COutPoint *)&DIRTY;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1d3e9e5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_bb8,local_bc8,0x3fb,1,2,&flags);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (view,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c00,local_c20,local_c40,0x3fc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c78,local_c98,local_cb8,0x3fd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()
            ((anon_class_16_2_c349ca0a *)in_stack_ffffffffffffe478,(bool)in_stack_ffffffffffffe477);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (view,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf0,local_d10,local_d30,0x402,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d68,local_d88,local_da8,0x403,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewCache::SpendCoin
              (in_stack_ffffffffffffe488,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480),
               (Coin *)in_stack_ffffffffffffe478);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_de0,local_e00,local_e20,0x406,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe488);
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffe458);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffe468,&in_stack_ffffffffffffe460->hash,
             (uint32_t)((ulong)in_stack_ffffffffffffe458 >> 0x20));
  outp.n = local_14c;
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_15c[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_15c[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_15c[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_15c[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_15c[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_15c[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_15c[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_15c[7];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_154[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_154[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_154[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_154[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_154[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_154[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_154[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_154[7];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_16c[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_16c[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_16c[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_16c[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_16c[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_16c[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_16c[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_16c[7];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = auStack_164[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = auStack_164[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = auStack_164[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_164[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_164[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_164[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_164[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_164[7];
  MakeCoin((FlushTest *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
  Coin::operator=((Coin *)in_stack_ffffffffffffe468,(Coin *)in_stack_ffffffffffffe460);
  Coin::~Coin((Coin *)in_stack_ffffffffffffe458);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e58,local_e78,local_e98,0x40e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ed0,local_ef0,local_f10,0x40f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f48,local_f68,local_f88,0x410,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                *)in_stack_ffffffffffffe458);
  CCoinsViewCache::AddCoin
            (in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,
             SUB81((ulong)in_stack_ffffffffffffe4a0 >> 0x38,0));
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                *)in_stack_ffffffffffffe458);
  CCoinsViewCache::Sync(in_stack_ffffffffffffe488);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_fc0,local_fe0,local_1000,0x414,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1038,local_1058,local_1078,0x415,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    std::
    unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
    ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  *)in_stack_ffffffffffffe458);
    CCoinsViewCache::HaveCoinInCache
              ((CCoinsViewCache *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470),
               (COutPoint *)in_stack_ffffffffffffe468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10b0,local_10d0,local_10f0,0x416,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    std::
    unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
    ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  *)in_stack_ffffffffffffe458);
    CCoinsViewCache::SpendCoin
              (in_stack_ffffffffffffe488,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480),
               (Coin *)in_stack_ffffffffffffe478);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1128,local_1148,local_1168,0x418,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()
            ((anon_class_16_2_c349ca0a *)in_stack_ffffffffffffe478,(bool)in_stack_ffffffffffffe477);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11a0,local_11c0,local_11e0,0x41a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1218,local_1238,local_1258,0x41b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1290,local_12b0,local_12d0,0x41c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()
            ((anon_class_16_2_c349ca0a *)in_stack_ffffffffffffe478,(bool)in_stack_ffffffffffffe477);
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe488);
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffe458);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffe468,&in_stack_ffffffffffffe460->hash,
             (uint32_t)((ulong)in_stack_ffffffffffffe458 >> 0x20));
  outp.n = local_1e4;
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_1f4[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_1f4[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_1f4[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_1f4[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_1f4[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_1f4[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_1f4[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_1f4[7];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_1ec[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_1ec[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_1ec[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_1ec[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_1ec[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_1ec[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_1ec[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_1ec[7];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_204[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_204[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_204[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_204[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_204[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_204[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_204[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_204[7];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = auStack_1fc[0];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = auStack_1fc[1];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = auStack_1fc[2];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_1fc[3];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_1fc[4];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_1fc[5];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_1fc[6];
  outp.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_1fc[7];
  MakeCoin((FlushTest *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
  Coin::operator=((Coin *)in_stack_ffffffffffffe468,(Coin *)in_stack_ffffffffffffe460);
  Coin::~Coin((Coin *)in_stack_ffffffffffffe458);
  coin_val = coin.out.nValue;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1310,local_1330,local_1350,0x426,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1388,local_13a8,local_13c8,0x427,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    pCVar3 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           *)in_stack_ffffffffffffe458);
    (*(pCVar3->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
              (pCVar3,&outp);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1400,local_1420,local_1440,0x428,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    possible_overwrite = (undefined1)((ulong)in_stack_ffffffffffffe4a0 >> 0x38);
  } while (bVar2);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                *)in_stack_ffffffffffffe458);
  CCoinsViewCache::AddCoin
            (in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,
             (bool)possible_overwrite);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                *)in_stack_ffffffffffffe458);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
  GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                   (char *)in_stack_ffffffffffffe458,(COutPoint *)0x515a14);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "coin_val";
    in_stack_ffffffffffffe460 = (COutPoint *)&coin_val;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1ba8aa7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1480,local_1490,0x42f,1,2,&value);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    local_14e4[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x03';
    local_14e4[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_14e4[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_14e4[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_stack_ffffffffffffe468 = "DIRTY|FRESH";
    in_stack_ffffffffffffe460 = local_14e4;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1d3e9e5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
              (local_14e4[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14,
               local_14e4[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 4,0x430,1,2,
               &flags);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    CCoinsViewDB::HaveCoin
              (in_stack_ffffffffffffe478,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1520,local_1540,local_1560,0x433,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    std::
    unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
    ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  *)in_stack_ffffffffffffe458);
    CCoinsViewCache::SpendCoin
              (in_stack_ffffffffffffe488,
               (COutPoint *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480),
               (Coin *)in_stack_ffffffffffffe478);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1598,local_15b8,local_15d8,0x435,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                *)in_stack_ffffffffffffe458);
  CCoinsViewCache::Sync(in_stack_ffffffffffffe488);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                *)in_stack_ffffffffffffe458);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_ffffffffffffe458);
  GetCoinsMapEntry((CCoinsMap *)in_stack_ffffffffffffe468,(CAmount *)in_stack_ffffffffffffe460,
                   (char *)in_stack_ffffffffffffe458,(COutPoint *)0x515f55);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "ABSENT";
    in_stack_ffffffffffffe460 = (COutPoint *)&ABSENT;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1ba8aa7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1618,local_1628,0x43a,1,2,&value);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,(char (*) [1])in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe468 = "NO_ENTRY";
    in_stack_ffffffffffffe460 = (COutPoint *)&NO_ENTRY;
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x1d3e9e5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_1668,local_1678,0x43b,1,2,&flags);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,(size_t)in_stack_ffffffffffffe488,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    std::
    vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
    ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_ffffffffffffe468,(size_type)in_stack_ffffffffffffe460);
    std::
    unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
    ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  *)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe49f =
         CCoinsViewCache::HaveCoinInCache
                   ((CCoinsViewCache *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470)
                    ,(COutPoint *)in_stack_ffffffffffffe468);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    in_stack_ffffffffffffe490 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_16b0,local_16d0,local_16f0,0x43c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe49f,in_stack_ffffffffffffe498),
               (const_string *)in_stack_ffffffffffffe490,line_num,
               (const_string *)CONCAT17(in_stack_ffffffffffffe487,in_stack_ffffffffffffe480));
    in_stack_ffffffffffffe487 =
         CCoinsViewDB::HaveCoin
                   (in_stack_ffffffffffffe478,
                    (COutPoint *)CONCAT17(in_stack_ffffffffffffe477,in_stack_ffffffffffffe470));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe468,
               SUB81((ulong)in_stack_ffffffffffffe460 >> 0x38,0));
    in_stack_ffffffffffffe478 = (CCoinsViewDB *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe460,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe458);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe468,
               (pointer)in_stack_ffffffffffffe460,(unsigned_long)in_stack_ffffffffffffe458);
    in_stack_ffffffffffffe458 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1728,local_1748,local_1768,0x43d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffe458);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe458);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Coin::~Coin((Coin *)in_stack_ffffffffffffe458);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestFlushBehavior(
    CCoinsViewCacheTest* view,
    CCoinsViewDB& base,
    std::vector<std::unique_ptr<CCoinsViewCacheTest>>& all_caches,
    bool do_erasing_flush)
{
    CAmount value;
    char flags;
    size_t cache_usage;
    size_t cache_size;

    auto flush_all = [this, &all_caches](bool erase) {
        // Flush in reverse order to ensure that flushes happen from children up.
        for (auto i = all_caches.rbegin(); i != all_caches.rend(); ++i) {
            auto& cache = *i;
            cache->SanityCheck();
            // hashBlock must be filled before flushing to disk; value is
            // unimportant here. This is normally done during connect/disconnect block.
            cache->SetBestBlock(m_rng.rand256());
            erase ? cache->Flush() : cache->Sync();
        }
    };

    Txid txid = Txid::FromUint256(m_rng.rand256());
    COutPoint outp = COutPoint(txid, 0);
    Coin coin = MakeCoin();
    // Ensure the coins views haven't seen this coin before.
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!view->HaveCoin(outp));

    // --- 1. Adding a random coin to the child cache
    //
    view->AddCoin(outp, Coin(coin), false);

    cache_usage = view->DynamicMemoryUsage();
    cache_size = view->map().size();

    // `base` shouldn't have coin (no flush yet) but `view` should have cached it.
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(view->HaveCoin(outp));

    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin.out.nValue);
    BOOST_CHECK_EQUAL(flags, DIRTY|FRESH);

    // --- 2. Flushing all caches (without erasing)
    //
    flush_all(/*erase=*/ false);

    // CoinsMap usage should be unchanged since we didn't erase anything.
    BOOST_CHECK_EQUAL(cache_usage, view->DynamicMemoryUsage());
    BOOST_CHECK_EQUAL(cache_size, view->map().size());

    // --- 3. Ensuring the entry still exists in the cache and has been written to parent
    //
    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin.out.nValue);
    BOOST_CHECK_EQUAL(flags, 0);  // Flags should have been wiped.

    // Both views should now have the coin.
    BOOST_CHECK(base.HaveCoin(outp));
    BOOST_CHECK(view->HaveCoin(outp));

    if (do_erasing_flush) {
        // --- 4. Flushing the caches again (with erasing)
        //
        flush_all(/*erase=*/ true);

        // Memory does not necessarily go down due to the map using a memory pool
        BOOST_TEST(view->DynamicMemoryUsage() <= cache_usage);
        // Size of the cache must go down though
        BOOST_TEST(view->map().size() < cache_size);

        // --- 5. Ensuring the entry is no longer in the cache
        //
        GetCoinsMapEntry(view->map(), value, flags, outp);
        BOOST_CHECK_EQUAL(value, ABSENT);
        BOOST_CHECK_EQUAL(flags, NO_ENTRY);

        view->AccessCoin(outp);
        GetCoinsMapEntry(view->map(), value, flags, outp);
        BOOST_CHECK_EQUAL(value, coin.out.nValue);
        BOOST_CHECK_EQUAL(flags, 0);
    }

    // Can't overwrite an entry without specifying that an overwrite is
    // expected.
    BOOST_CHECK_THROW(
        view->AddCoin(outp, Coin(coin), /*possible_overwrite=*/ false),
        std::logic_error);

    // --- 6. Spend the coin.
    //
    BOOST_CHECK(view->SpendCoin(outp));

    // The coin should be in the cache, but spent and marked dirty.
    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, SPENT);
    BOOST_CHECK_EQUAL(flags, DIRTY);
    BOOST_CHECK(!view->HaveCoin(outp)); // Coin should be considered spent in `view`.
    BOOST_CHECK(base.HaveCoin(outp));  // But coin should still be unspent in `base`.

    flush_all(/*erase=*/ false);

    // Coin should be considered spent in both views.
    BOOST_CHECK(!view->HaveCoin(outp));
    BOOST_CHECK(!base.HaveCoin(outp));

    // Spent coin should not be spendable.
    BOOST_CHECK(!view->SpendCoin(outp));

    // --- Bonus check: ensure that a coin added to the base view via one cache
    //     can be spent by another cache which has never seen it.
    //
    txid = Txid::FromUint256(m_rng.rand256());
    outp = COutPoint(txid, 0);
    coin = MakeCoin();
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    all_caches[0]->AddCoin(outp, std::move(coin), false);
    all_caches[0]->Sync();
    BOOST_CHECK(base.HaveCoin(outp));
    BOOST_CHECK(all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoinInCache(outp));

    BOOST_CHECK(all_caches[1]->SpendCoin(outp));
    flush_all(/*erase=*/ false);
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    flush_all(/*erase=*/ true); // Erase all cache content.

    // --- Bonus check 2: ensure that a FRESH, spent coin is deleted by Sync()
    //
    txid = Txid::FromUint256(m_rng.rand256());
    outp = COutPoint(txid, 0);
    coin = MakeCoin();
    CAmount coin_val = coin.out.nValue;
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    // Add and spend from same cache without flushing.
    all_caches[0]->AddCoin(outp, std::move(coin), false);

    // Coin should be FRESH in the cache.
    GetCoinsMapEntry(all_caches[0]->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin_val);
    BOOST_CHECK_EQUAL(flags, DIRTY|FRESH);

    // Base shouldn't have seen coin.
    BOOST_CHECK(!base.HaveCoin(outp));

    BOOST_CHECK(all_caches[0]->SpendCoin(outp));
    all_caches[0]->Sync();

    // Ensure there is no sign of the coin after spend/flush.
    GetCoinsMapEntry(all_caches[0]->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, ABSENT);
    BOOST_CHECK_EQUAL(flags, NO_ENTRY);
    BOOST_CHECK(!all_caches[0]->HaveCoinInCache(outp));
    BOOST_CHECK(!base.HaveCoin(outp));
}